

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O0

int __thiscall QTreeViewPrivate::pageUp(QTreeViewPrivate *this,int i)

{
  bool bVar1;
  int i_00;
  qsizetype qVar2;
  QTreeViewPrivate *in_RDI;
  int unaff_retaddr;
  QTreeViewPrivate *in_stack_00000008;
  int index;
  QTreeViewPrivate *in_stack_00000038;
  int local_2c;
  int local_10;
  
  i_00 = coordinateForItem(in_stack_00000008,unaff_retaddr);
  QWidget::height((QWidget *)0x8fc26b);
  local_10 = itemAtCoordinate(in_stack_00000038,this._4_4_);
  while (bVar1 = isItemHiddenOrDisabled(in_RDI,i_00), bVar1) {
    local_10 = local_10 + -1;
  }
  if (local_10 == -1) {
    local_10 = 0;
  }
  while (bVar1 = isItemHiddenOrDisabled(in_RDI,i_00), bVar1) {
    local_10 = local_10 + 1;
  }
  qVar2 = QList<QTreeViewItem>::size(&in_RDI->viewItems);
  if (local_10 < qVar2) {
    local_2c = local_10;
  }
  else {
    local_2c = 0;
  }
  return local_2c;
}

Assistant:

int QTreeViewPrivate::pageUp(int i) const
{
    int index = itemAtCoordinate(coordinateForItem(i) - viewport->height());
    while (isItemHiddenOrDisabled(index))
        index--;
    if (index == -1)
        index = 0;
    while (isItemHiddenOrDisabled(index))
        index++;
    return index >= viewItems.size() ? 0 : index;
}